

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<signed_char,short>(uint length,char value)

{
  long lVar1;
  char *__p;
  short *__p_00;
  undefined8 *puVar2;
  ulong uVar3;
  char *local_48;
  shared_ptr<signed_char> pt;
  shared_ptr<short> pu;
  
  __p = sse::common::malloc<signed_char>(length);
  std::__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<signed_char,void(*)(signed_char*),void>
            ((__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p,
             sse::common::free<signed_char>);
  __p_00 = sse::common::malloc<short>(length);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p_00,
             sse::common::free<short>);
  nosimd::common::set<signed_char>(value,local_48,length);
  nosimd::common::convert<signed_char,short>
            (local_48,(short *)pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,length);
  uVar3 = 0;
  do {
    if (length == uVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    lVar1 = uVar3 * 2;
    uVar3 = uVar3 + 1;
  } while (*(short *)((long)&(pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) == (short)value);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = signed char, _U = short]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}